

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::M3DImporter::importBones(M3DImporter *this,M3DWrapper *m3d,uint parentid,aiNode *pParent)

{
  uint uVar1;
  char *__s;
  M3DWrapper *m3d_00;
  bool bVar2;
  Logger *this_00;
  m3d_t *pmVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *this_01;
  ulong uVar5;
  aiNode **ppaVar6;
  aiNode *this_02;
  aiMatrix4x4 *m;
  allocator<char> local_609;
  string local_608;
  aiString local_5e4;
  aiNode *local_1e0;
  aiNode *pChild;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_50;
  uint local_30;
  uint local_2c;
  uint n;
  uint i;
  aiNode *pParent_local;
  M3DWrapper *pMStack_18;
  uint parentid_local;
  M3DWrapper *m3d_local;
  M3DImporter *this_local;
  
  _n = pParent;
  pParent_local._4_4_ = parentid;
  pMStack_18 = m3d;
  m3d_local = (M3DWrapper *)this;
  if (pParent == (aiNode *)0x0) {
    __assert_fail("pParent != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x1e4,
                  "void Assimp::M3DImporter::importBones(const M3DWrapper &, unsigned int, aiNode *)"
                 );
  }
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x1e5,
                  "void Assimp::M3DImporter::importBones(const M3DWrapper &, unsigned int, aiNode *)"
                 );
  }
  bVar2 = M3DWrapper::operator_cast_to_bool(m3d);
  if (bVar2) {
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[18]>(&local_1c8,(char (*) [18])"M3D: importBones ");
    pmVar3 = M3DWrapper::operator->(pMStack_18);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1c8,&pmVar3->numbone);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar4,(char (*) [11])" parentid ");
    pChild._0_4_ = pParent_local._4_4_;
    this_01 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(pbVar4,(int *)&pChild);
    Formatter::basic_formatter::operator_cast_to_string(&local_50,this_01);
    Logger::debug(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1c8);
    local_30 = 0;
    local_2c = pParent_local._4_4_;
    while( true ) {
      local_2c = local_2c + 1;
      uVar1 = local_2c;
      pmVar3 = M3DWrapper::operator->(pMStack_18);
      if (pmVar3->numbone <= uVar1) break;
      pmVar3 = M3DWrapper::operator->(pMStack_18);
      if (pmVar3->bone[local_2c].parent == pParent_local._4_4_) {
        local_30 = local_30 + 1;
      }
    }
    uVar5 = SUB168(ZEXT416(local_30) * ZEXT816(8),0);
    if (SUB168(ZEXT416(local_30) * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppaVar6 = (aiNode **)operator_new__(uVar5);
    _n->mChildren = ppaVar6;
    local_2c = pParent_local._4_4_;
    while( true ) {
      local_2c = local_2c + 1;
      uVar1 = local_2c;
      pmVar3 = M3DWrapper::operator->(pMStack_18);
      if (pmVar3->numbone <= uVar1) break;
      pmVar3 = M3DWrapper::operator->(pMStack_18);
      if (pmVar3->bone[local_2c].parent == pParent_local._4_4_) {
        this_02 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(this_02);
        this_02->mParent = _n;
        local_1e0 = this_02;
        pmVar3 = M3DWrapper::operator->(pMStack_18);
        __s = pmVar3->bone[local_2c].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,__s,&local_609);
        aiString::aiString(&local_5e4,&local_608);
        aiString::operator=(&local_1e0->mName,&local_5e4);
        std::__cxx11::string::~string((string *)&local_608);
        std::allocator<char>::~allocator(&local_609);
        m3d_00 = pMStack_18;
        m = &local_1e0->mTransformation;
        pmVar3 = M3DWrapper::operator->(pMStack_18);
        uVar1 = pmVar3->bone[local_2c].pos;
        pmVar3 = M3DWrapper::operator->(pMStack_18);
        convertPose(this,m3d_00,m,uVar1,pmVar3->bone[local_2c].ori);
        local_1e0->mNumChildren = 0;
        _n->mChildren[_n->mNumChildren] = local_1e0;
        _n->mNumChildren = _n->mNumChildren + 1;
        importBones(this,pMStack_18,local_2c,local_1e0);
      }
    }
    return;
  }
  __assert_fail("m3d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x1e6,
                "void Assimp::M3DImporter::importBones(const M3DWrapper &, unsigned int, aiNode *)")
  ;
}

Assistant:

void M3DImporter::importBones(const M3DWrapper &m3d, unsigned int parentid, aiNode *pParent) {
	unsigned int i, n;

	ai_assert(pParent != nullptr);
	ai_assert(mScene != nullptr);
	ai_assert(m3d);

	ASSIMP_LOG_DEBUG_F("M3D: importBones ", m3d->numbone, " parentid ", (int)parentid);

	for (n = 0, i = parentid + 1; i < m3d->numbone; i++)
		if (m3d->bone[i].parent == parentid) n++;
	pParent->mChildren = new aiNode *[n];

	for (i = parentid + 1; i < m3d->numbone; i++) {
		if (m3d->bone[i].parent == parentid) {
			aiNode *pChild = new aiNode;
			pChild->mParent = pParent;
			pChild->mName = aiString(std::string(m3d->bone[i].name));
			convertPose(m3d, &pChild->mTransformation, m3d->bone[i].pos, m3d->bone[i].ori);
			pChild->mNumChildren = 0;
			pParent->mChildren[pParent->mNumChildren] = pChild;
			pParent->mNumChildren++;
			importBones(m3d, i, pChild);
		}
	}
}